

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMultisampleInterpolationTests.cpp
# Opt level: O0

void __thiscall
vkt::pipeline::multisample::MSInstance<vkt::pipeline::multisample::MSInstanceDistinctValues>::
uploadVertexData(MSInstance<vkt::pipeline::multisample::MSInstanceDistinctValues> *this,
                Allocation *vertexBufferAllocation,VertexDataDesc *vertexDataDescripton)

{
  void *dst;
  VertexDataNdc *src;
  Vector<float,_4> local_a4;
  VertexDataNdc local_94;
  Vector<float,_4> local_84;
  VertexDataNdc local_74;
  Vector<float,_4> local_58;
  VertexDataNdc local_48;
  undefined1 local_38 [8];
  vector<vkt::pipeline::multisample::VertexDataNdc,_std::allocator<vkt::pipeline::multisample::VertexDataNdc>_>
  vertices;
  VertexDataDesc *vertexDataDescripton_local;
  Allocation *vertexBufferAllocation_local;
  MSInstance<vkt::pipeline::multisample::MSInstanceDistinctValues> *this_local;
  
  vertices.
  super__Vector_base<vkt::pipeline::multisample::VertexDataNdc,_std::allocator<vkt::pipeline::multisample::VertexDataNdc>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)vertexDataDescripton;
  std::
  vector<vkt::pipeline::multisample::VertexDataNdc,_std::allocator<vkt::pipeline::multisample::VertexDataNdc>_>
  ::vector((vector<vkt::pipeline::multisample::VertexDataNdc,_std::allocator<vkt::pipeline::multisample::VertexDataNdc>_>
            *)local_38);
  tcu::Vector<float,_4>::Vector(&local_58,-1.0,-1.0,0.0,1.0);
  VertexDataNdc::VertexDataNdc(&local_48,&local_58);
  std::
  vector<vkt::pipeline::multisample::VertexDataNdc,_std::allocator<vkt::pipeline::multisample::VertexDataNdc>_>
  ::push_back((vector<vkt::pipeline::multisample::VertexDataNdc,_std::allocator<vkt::pipeline::multisample::VertexDataNdc>_>
               *)local_38,&local_48);
  tcu::Vector<float,_4>::Vector(&local_84,-1.0,4.0,0.0,1.0);
  VertexDataNdc::VertexDataNdc(&local_74,&local_84);
  std::
  vector<vkt::pipeline::multisample::VertexDataNdc,_std::allocator<vkt::pipeline::multisample::VertexDataNdc>_>
  ::push_back((vector<vkt::pipeline::multisample::VertexDataNdc,_std::allocator<vkt::pipeline::multisample::VertexDataNdc>_>
               *)local_38,&local_74);
  tcu::Vector<float,_4>::Vector(&local_a4,4.0,-1.0,0.0,1.0);
  VertexDataNdc::VertexDataNdc(&local_94,&local_a4);
  std::
  vector<vkt::pipeline::multisample::VertexDataNdc,_std::allocator<vkt::pipeline::multisample::VertexDataNdc>_>
  ::push_back((vector<vkt::pipeline::multisample::VertexDataNdc,_std::allocator<vkt::pipeline::multisample::VertexDataNdc>_>
               *)local_38,&local_94);
  dst = ::vk::Allocation::getHostPtr(vertexBufferAllocation);
  src = dataPointer<vkt::pipeline::multisample::VertexDataNdc>
                  ((vector<vkt::pipeline::multisample::VertexDataNdc,_std::allocator<vkt::pipeline::multisample::VertexDataNdc>_>
                    *)local_38);
  ::deMemcpy(dst,src,*(size_t *)
                      vertices.
                      super__Vector_base<vkt::pipeline::multisample::VertexDataNdc,_std::allocator<vkt::pipeline::multisample::VertexDataNdc>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage[1].positionNdc.m_data);
  std::
  vector<vkt::pipeline::multisample::VertexDataNdc,_std::allocator<vkt::pipeline::multisample::VertexDataNdc>_>
  ::~vector((vector<vkt::pipeline::multisample::VertexDataNdc,_std::allocator<vkt::pipeline::multisample::VertexDataNdc>_>
             *)local_38);
  return;
}

Assistant:

void MSInstance<MSInstanceDistinctValues>::uploadVertexData (const Allocation& vertexBufferAllocation, const VertexDataDesc& vertexDataDescripton) const
{
	std::vector<VertexDataNdc> vertices;

	vertices.push_back(VertexDataNdc(tcu::Vec4(-1.0f, -1.0f, 0.0f, 1.0f)));
	vertices.push_back(VertexDataNdc(tcu::Vec4(-1.0f,  4.0f, 0.0f, 1.0f)));
	vertices.push_back(VertexDataNdc(tcu::Vec4( 4.0f, -1.0f, 0.0f, 1.0f)));

	deMemcpy(vertexBufferAllocation.getHostPtr(), dataPointer(vertices), static_cast<std::size_t>(vertexDataDescripton.dataSize));
}